

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_infinity(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint __fd;
  undefined8 uVar4;
  ulong __n;
  int *__needle;
  int *__buf;
  void *__s1;
  void *__s2;
  undefined8 uVar5;
  double *pdVar6;
  long *plVar7;
  long lVar8;
  undefined8 extraout_RAX;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  int *__haystack;
  char *pcVar12;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  undefined **ppuVar16;
  undefined **ppuVar17;
  double d;
  bson_t b;
  bson_error_t error;
  code **ppcVar18;
  undefined4 uStack_165c;
  undefined8 uStack_1658;
  undefined2 uStack_1650;
  int iStack_1648;
  int iStack_1644;
  char acStack_1640 [504];
  code *pcStack_1448;
  undefined1 auStack_1438 [512];
  char *pcStack_1238;
  code *pcStack_1230;
  int iStack_1220;
  int iStack_121c;
  char acStack_1218 [504];
  long *plStack_1020;
  double *pdStack_1018;
  char *pcStack_1010;
  code *pcStack_1008;
  long lStack_f90;
  long lStack_f88;
  undefined1 auStack_f80 [128];
  undefined1 auStack_f00 [232];
  undefined1 auStack_e18 [608];
  long *plStack_bb8;
  code *pcStack_bb0;
  undefined1 auStack_ba8 [8];
  char acStack_ba0 [16];
  char *pcStack_b90;
  code *pcStack_b88;
  uint uStack_b04;
  undefined8 uStack_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 uStack_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 uStack_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 uStack_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined1 auStack_a38 [648];
  int *piStack_7b0;
  double *pdStack_7a8;
  undefined **ppuStack_7a0;
  int *piStack_798;
  int *piStack_790;
  code *pcStack_788;
  undefined1 auStack_780 [240];
  undefined1 auStack_690 [648];
  code *apcStack_408 [16];
  double local_388;
  int local_380 [50];
  int local_2b8;
  int local_2b4;
  int local_2b0 [160];
  
  pcVar12 = "{ \"d\": Infinity }";
  ppuVar17 = &PTR_anon_var_dwarf_1b13e_001613b8;
  do {
    apcStack_408[0] = (code *)0x132c81;
    cVar1 = bson_init_from_json(local_380,pcVar12,0xffffffffffffffff,&local_2b8);
    if (cVar1 == '\0') {
      apcStack_408[0] = (code *)0x132eb1;
      test_bson_json_infinity_cold_1();
LAB_00132eb1:
      apcStack_408[0] = (code *)0x132eb6;
      test_bson_json_infinity_cold_2();
LAB_00132eb6:
      apcStack_408[0] = (code *)0x132ebb;
      test_bson_json_infinity_cold_3();
      goto LAB_00132ebb;
    }
    apcStack_408[0] = (code *)0x132c8e;
    uVar4 = bson_bcone_magic();
    apcStack_408[0] = (code *)0x132ca9;
    cVar1 = bcon_extract(local_380,"d",uVar4,1,&local_388,0);
    if (cVar1 == '\0') goto LAB_00132eb1;
    if ((NAN(local_388)) || (!NAN(local_388 - local_388) && !NAN(local_388 - local_388)))
    goto LAB_00132eb6;
    apcStack_408[0] = (code *)0x132cd7;
    bson_destroy(local_380);
    pcVar12 = *ppuVar17;
    ppuVar17 = ppuVar17 + 1;
  } while (pcVar12 != (char *)0x0);
  pcVar12 = "{ \"d\": -Infinity }";
  ppuVar17 = &PTR_anon_var_dwarf_1b162_001613d8;
  do {
    apcStack_408[0] = (code *)0x132d20;
    cVar1 = bson_init_from_json(local_380,pcVar12,0xffffffffffffffff,&local_2b8);
    if (cVar1 == '\0') goto LAB_00132ebb;
    apcStack_408[0] = (code *)0x132d2d;
    uVar4 = bson_bcone_magic();
    apcStack_408[0] = (code *)0x132d48;
    cVar1 = bcon_extract(local_380,"d",uVar4,1,&local_388,0);
    if (cVar1 == '\0') goto LAB_00132ec0;
    if ((NAN(local_388)) || (!NAN(local_388 - local_388))) goto LAB_00132ec5;
    if (0.0 <= local_388) goto LAB_00132eca;
    apcStack_408[0] = (code *)0x132d88;
    bson_destroy(local_380);
    pcVar12 = *ppuVar17;
    ppuVar17 = ppuVar17 + 1;
  } while (pcVar12 != (char *)0x0);
  pcVar13 = "{ \"d\": Infinityy }";
  ppuVar17 = &PTR_anon_var_dwarf_1b186_001613f8;
  __haystack = local_2b0;
  __buf = local_380;
  __needle = &local_2b8;
  pcVar12 = "Got parse error at";
  do {
    apcStack_408[0] = (code *)0x132dd8;
    cVar1 = bson_init_from_json(__buf,pcVar13,0xffffffffffffffff,__needle);
    if (cVar1 != '\0') goto LAB_00132ecf;
    if (local_2b8 != 1) goto LAB_00132ee6;
    if (local_2b4 != 1) goto LAB_00132ed9;
    apcStack_408[0] = (code *)0x132e0b;
    pcVar13 = strstr((char *)__haystack,"Got parse error at");
    if (pcVar13 == (char *)0x0) goto LAB_00132ede;
    pcVar13 = *ppuVar17;
    ppuVar17 = ppuVar17 + 1;
  } while (pcVar13 != (char *)0x0);
  pcVar13 = "{ \"d\": In";
  ppuVar17 = &PTR_anon_var_dwarf_1b1e6_00161448;
  __haystack = local_2b0;
  __buf = local_380;
  __needle = &local_2b8;
  pcVar12 = "Incomplete JSON";
  while( true ) {
    apcStack_408[0] = (code *)0x132e60;
    cVar1 = bson_init_from_json(__buf,pcVar13,0xffffffffffffffff,__needle);
    if (cVar1 != '\0') break;
    if (local_2b8 != 1) goto LAB_00132ef8;
    if (local_2b4 != 1) goto LAB_00132eeb;
    apcStack_408[0] = (code *)0x132e8b;
    pcVar13 = strstr((char *)__haystack,"Incomplete JSON");
    if (pcVar13 == (char *)0x0) goto LAB_00132ef0;
    pcVar13 = *ppuVar17;
    ppuVar17 = ppuVar17 + 1;
    if (pcVar13 == (char *)0x0) {
      return;
    }
  }
LAB_00132ed4:
  apcStack_408[0] = (code *)0x132ed9;
  test_bson_json_infinity_cold_13();
LAB_00132ed9:
  apcStack_408[0] = (code *)0x132ede;
  test_bson_json_infinity_cold_9();
LAB_00132ede:
  apcStack_408[0] = (code *)0x132ee6;
  test_bson_json_infinity_cold_14();
LAB_00132ee6:
  apcStack_408[0] = (code *)0x132eeb;
  test_bson_json_infinity_cold_8();
LAB_00132eeb:
  apcStack_408[0] = (code *)0x132ef0;
  test_bson_json_infinity_cold_11();
LAB_00132ef0:
  apcStack_408[0] = (code *)0x132ef8;
  test_bson_json_infinity_cold_12();
LAB_00132ef8:
  apcStack_408[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_788 = (code *)0x132f2a;
  apcStack_408[0] = (code *)&stack0xfffffffffffffff8;
  cVar1 = bson_init_from_json(auStack_780,"{ \"x\": null }",0xffffffffffffffff,auStack_690);
  if (cVar1 == '\0') {
    pcStack_788 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_788 = (code *)0x132f33;
    uVar4 = bson_bcone_magic();
    pcStack_788 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_780,"x",uVar4,9,0);
    if (cVar1 != '\0') {
      pcStack_788 = (code *)0x132f5b;
      bson_destroy(auStack_780);
      return;
    }
  }
  pcStack_788 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_b88 = (code *)0x0;
  pcStack_b90 = "}";
  acStack_ba0[8] = -0x52;
  acStack_ba0[9] = '/';
  acStack_ba0[10] = '\x13';
  acStack_ba0[0xb] = '\0';
  acStack_ba0[0xc] = '\0';
  acStack_ba0[0xd] = '\0';
  acStack_ba0[0xe] = '\0';
  acStack_ba0[0xf] = '\0';
  piStack_7b0 = __haystack;
  pdStack_7a8 = (double *)pcVar12;
  ppuStack_7a0 = ppuVar17;
  piStack_798 = __buf;
  piStack_790 = __needle;
  pcStack_788 = (code *)apcStack_408;
  __n = bcon_new(0,"a","{","b","{");
  uStack_a90 = 0;
  uStack_a88 = 0;
  uStack_aa0 = 0;
  uStack_a98 = 0;
  uStack_ab0 = 0;
  uStack_aa8 = 0;
  uStack_ac0 = 0;
  uStack_ab8 = 0;
  uStack_ad0 = 0;
  uStack_ac8 = 0;
  uStack_ae0 = 0;
  uStack_ad8 = 0;
  uStack_af0 = 0;
  uStack_ae8 = 0;
  uStack_b00 = (undefined *)0x500000003;
  uStack_af8 = 5;
  pcStack_b88 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_b00,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_a38);
  if (cVar1 != '\0') {
    pcStack_b88 = (code *)0x133023;
    __needle = (int *)bson_get_data(&uStack_b00);
    pcStack_b88 = (code *)0x13302e;
    __buf = (int *)bson_get_data(__n);
    if (*(int *)(__n + 4) == uStack_b00._4_4_) {
      pcStack_b88 = (code *)0x133043;
      __s1 = (void *)bson_get_data(__n);
      pcStack_b88 = (code *)0x133053;
      __s2 = (void *)bson_get_data(&uStack_b00);
      pcStack_b88 = (code *)0x133061;
      iVar2 = bcmp(__s1,__s2,(ulong)*(uint *)(__n + 4));
      if (iVar2 == 0) {
        pcStack_b88 = (code *)0x133072;
        bson_destroy(&uStack_b00);
        pcStack_b88 = (code *)0x13307a;
        bson_destroy(__n);
        return;
      }
    }
    ppuVar17 = (undefined **)&uStack_b00;
    pcStack_b88 = (code *)0x13309b;
    uVar4 = bson_as_canonical_extended_json(ppuVar17);
    pcStack_b88 = (code *)0x1330a8;
    uVar5 = bson_as_canonical_extended_json(__n);
    uVar11 = 0xffffffff;
    if (uStack_b00._4_4_ != 0) {
      uVar14 = 0;
      do {
        if (*(int *)(__n + 4) == (int)uVar14) break;
        if (*(char *)((long)__needle + uVar14) != *(char *)((long)__buf + uVar14)) {
          uVar11 = uVar14 & 0xffffffff;
          break;
        }
        uVar14 = uVar14 + 1;
      } while (uStack_b00._4_4_ != (uint)uVar14);
    }
    if ((int)uVar11 == -1) {
      uVar3 = uStack_b00._4_4_;
      if (uStack_b00._4_4_ < *(uint *)(__n + 4)) {
        uVar3 = *(uint *)(__n + 4);
      }
      uVar11 = (ulong)(uVar3 - 1);
    }
    pcStack_b88 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar11,uVar4,uVar5);
    pcStack_b88 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar12 = (char *)(ulong)uVar3;
    pcStack_b88 = (code *)0x133136;
    __fd = open("failure.expected.bson",0x42,0x1a0);
    uStack_b04 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_b88 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_b88 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_b88 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      ppuVar17 = (undefined **)(ulong)__fd;
      if (__fd == 0xffffffff) goto LAB_0013318c;
      pcVar12 = (char *)((ulong)uStack_b00 >> 0x20);
      pcStack_b88 = (code *)0x133160;
      pdVar6 = (double *)write(uVar3,__needle,(size_t)pcVar12);
      if (pdVar6 != (double *)pcVar12) goto LAB_00133191;
      __n = (ulong)*(uint *)(__n + 4);
      pcStack_b88 = (code *)0x133176;
      uVar11 = write(__fd,__buf,__n);
      if (uVar11 == __n) {
        pcStack_b88 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_b88 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_b88 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar13 = acStack_ba0;
  acStack_ba0[8] = '\0';
  acStack_ba0[9] = '\0';
  acStack_ba0[10] = '\0';
  acStack_ba0[0xb] = '\0';
  acStack_ba0[0xc] = '\0';
  acStack_ba0[0xd] = '\0';
  acStack_ba0[0xe] = '@';
  acStack_ba0[0xf] = '0';
  acStack_ba0[0] = '\v';
  acStack_ba0[1] = '\0';
  acStack_ba0[2] = '\0';
  acStack_ba0[3] = '\0';
  acStack_ba0[4] = '\0';
  acStack_ba0[5] = '\0';
  acStack_ba0[6] = '\0';
  acStack_ba0[7] = '\0';
  pcStack_bb0 = (code *)0x1331ce;
  pcStack_b90 = (char *)__n;
  pcStack_b88 = (code *)__buf;
  plVar7 = (long *)bson_new();
  pcStack_bb0 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar7,"decimal128",0xffffffff,pcVar13);
  if (cVar1 == '\0') {
    pcStack_bb0 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_bb0 = (code *)0x1331f7;
    pcVar13 = (char *)bson_as_json(plVar7,auStack_ba8);
    if (pcVar13 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_bb0 = (code *)0x133221;
      bson_free(pcVar13);
      pcStack_bb0 = (code *)0x133229;
      bson_destroy(plVar7);
      return;
    }
    pcStack_bb0 = (code *)0x133215;
    iVar2 = strcmp(pcVar13,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_bb0 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar18 = &pcStack_bb0;
  pcStack_1008 = (code *)0x133271;
  plStack_bb8 = plVar7;
  pcStack_bb0 = (code *)&pcStack_788;
  cVar1 = bson_init_from_json(auStack_f00,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_e18);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_1008 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_f80,auStack_f00);
  if (cVar1 == '\0') {
    pcStack_1008 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_1008 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_1008 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_1008 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_1008 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_f80,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_1008 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_f80);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar7 = &lStack_f90;
    pcStack_1008 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_f80,plVar7);
    if (lStack_f90 != 0xb) goto LAB_0013330b;
    if (lStack_f88 == 0x3040000000000000) {
      pcStack_1008 = (code *)0x1332f5;
      bson_destroy(auStack_f00);
      return;
    }
  }
  pcStack_1008 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_1008 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar15 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar16 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_1020 = plVar7;
  pdStack_1018 = (double *)pcVar12;
  pcStack_1010 = pcVar13;
  pcStack_1008 = (code *)__needle;
  do {
    pcStack_1230 = (code *)0x133357;
    lVar8 = bson_new_from_json(pcVar15,0xffffffffffffffff,&iStack_1220);
    if (lVar8 != 0) {
      pcStack_1230 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_1230 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_1218,
              __needle);
      pcStack_1230 = (code *)0x1333c7;
      abort();
    }
    if (iStack_1220 != 1) {
LAB_001333cc:
      pcStack_1230 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_1448 = (code *)0x1333f1;
      pcStack_1238 = acStack_1218;
      pcStack_1230 = (code *)&iStack_1220;
      pcVar12 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_1438);
      pcStack_1448 = (code *)0x1333fe;
      pcVar13 = (char *)bson_as_json(pcVar12,0);
      if (pcVar13 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_1448 = (code *)0x133428;
        bson_free(pcVar13);
        pcStack_1448 = (code *)0x133430;
        bson_destroy(pcVar12);
        return;
      }
      pcStack_1448 = (code *)0x13341c;
      iVar2 = strcmp(pcVar13,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_1448 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_1658 = 0x2200223a2261227b;
      uStack_1650 = 0x7d;
      uStack_165c = 0x227b;
      pcStack_1448 = (code *)pcVar12;
      lVar8 = bson_new_from_json(&uStack_1658,9,&iStack_1648);
      if (lVar8 == 0) {
        if (iStack_1648 != 1) goto LAB_001334fc;
        if (iStack_1644 != 1) goto LAB_00133501;
        pcVar12 = acStack_1640;
        pcVar15 = strstr(pcVar12,"Got parse error");
        if (pcVar15 == (char *)0x0) goto LAB_00133506;
        lVar8 = bson_new_from_json(&uStack_165c,3,&iStack_1648);
        if (lVar8 != 0) goto LAB_001334f7;
        if (iStack_1648 != 1) goto LAB_0013350e;
        if (iStack_1644 == 1) {
          pcVar15 = strstr(pcVar12,"Got parse error");
          if (pcVar15 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar4 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar5 = bson_bcon_magic();
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0,uVar4,pcVar12,ppuVar16,ppuVar17,pcVar13,__needle,ppcVar18
                      );
      uVar9 = bcon_new(0,"b",uVar5,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar4,uVar9,0);
      uVar4 = bson_new();
      uVar9 = bson_new();
      uVar10 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar4,uVar9,uVar10,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,"b",uVar5,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar4,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar4,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar4,0);
      uVar4 = bcon_new(0,"a",uVar5,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar4,0);
      uVar4 = bson_new();
      _test_json_produces_multiple("[]",0,uVar4,0);
      uVar4 = bcon_new(0,"0","{","x",uVar5,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar4,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_121c != 2) {
      pcStack_1230 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    __needle = (int *)ppuVar16[-1];
    pcStack_1230 = (code *)0x13337e;
    pcVar12 = strstr(acStack_1218,(char *)__needle);
    if (pcVar12 == (char *)0x0) goto LAB_001333a4;
    pcVar15 = *ppuVar16;
    ppuVar16 = ppuVar16 + 2;
    if (pcVar15 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00132ebb:
  apcStack_408[0] = (code *)0x132ec0;
  test_bson_json_infinity_cold_4();
LAB_00132ec0:
  apcStack_408[0] = (code *)0x132ec5;
  test_bson_json_infinity_cold_5();
LAB_00132ec5:
  apcStack_408[0] = (code *)0x132eca;
  test_bson_json_infinity_cold_6();
LAB_00132eca:
  __buf = &local_2b8;
  pcVar12 = (char *)&local_388;
  __haystack = local_380;
  __needle = (int *)0x14a6f6;
  apcStack_408[0] = (code *)0x132ecf;
  test_bson_json_infinity_cold_7();
LAB_00132ecf:
  apcStack_408[0] = (code *)0x132ed4;
  test_bson_json_infinity_cold_15();
  goto LAB_00132ed4;
}

Assistant:

static void
test_bson_json_infinity (void)
{
   bson_error_t error;
   bson_t b;
   double d;

   /* should parse any capitalization of Infinity */
   const char *infs[] = {"{ \"d\": Infinity }",
                         "{ \"d\": infinity }",
                         "{ \"d\": inFINIty }",
                         NULL};

   const char *negs[] = {"{ \"d\": -Infinity }",
                         "{ \"d\": -infinity }",
                         "{ \"d\": -inFINIty }",
                         NULL};

   const char *bad[] = {"{ \"d\": Infinityy }",
                        "{ \"d\": Infinit }",
                        "{ \"d\": -Infinityy }",
                        "{ \"d\": -Infinit }",
                        "{ \"d\": infinityy }",
                        "{ \"d\": infinit }",
                        "{ \"d\": -infinityy }",
                        "{ \"d\": -infinit }",
                        NULL};

   const char *partial[] = {"{ \"d\": In", "{ \"d\": I", "{ \"d\": i", NULL};
   const char **j;

   for (j = infs; *j; j++) {
      BSON_ASSERT (bson_init_from_json (&b, *j, -1, &error));
      BSON_ASSERT (BCON_EXTRACT (&b, "d", BCONE_DOUBLE (d)));
      /* Infinite */
      BSON_ASSERT (d == d && ((d - d) != (d - d)));
      bson_destroy (&b);
   }

   for (j = negs; *j; j++) {
      BSON_ASSERT (bson_init_from_json (&b, *j, -1, &error));
      BSON_ASSERT (BCON_EXTRACT (&b, "d", BCONE_DOUBLE (d)));
      /* Infinite */
      BSON_ASSERT (d == d && ((d - d) != (d - d)));
      BSON_ASSERT (d < 0);
      bson_destroy (&b);
   }

   for (j = bad; *j; j++) {
      BSON_ASSERT (!bson_init_from_json (&b, *j, -1, &error));
      ASSERT_ERROR_CONTAINS (error,
                             BSON_ERROR_JSON,
                             BSON_JSON_ERROR_READ_CORRUPT_JS,
                             "Got parse error at");
   }

   for (j = partial; *j; j++) {
      BSON_ASSERT (!bson_init_from_json (&b, *j, -1, &error));
      ASSERT_ERROR_CONTAINS (error,
                             BSON_ERROR_JSON,
                             BSON_JSON_ERROR_READ_CORRUPT_JS,
                             "Incomplete JSON");
   }
}